

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

void __thiscall
snappy::SnappyDecompressor::DecompressAllTags<snappy::SnappyIOVecWriter>
          (SnappyDecompressor *this,SnappyIOVecWriter *writer)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  int iVar4;
  ulong in_RAX;
  undefined4 extraout_var;
  ulong len;
  ulong len_00;
  uint *ip;
  byte *pbVar5;
  ulong uVar6;
  size_t n;
  ulong local_38;
  
  pbVar5 = (byte *)this->ip_;
  local_38 = in_RAX;
  if ((long)this->ip_limit_ - (long)pbVar5 < 5) {
    bVar3 = RefillTag(this);
    if (!bVar3) {
      return;
    }
    pbVar5 = (byte *)this->ip_;
  }
LAB_00165b8f:
  do {
    bVar1 = *pbVar5;
    ip = (uint *)(pbVar5 + 1);
    if ((bVar1 & 3) == 0) {
      len_00 = (ulong)(bVar1 >> 2) + 1;
      bVar3 = SnappyIOVecWriter::TryFastAppend
                        (writer,(char *)ip,(long)this->ip_limit_ - (long)ip,len_00);
      if (bVar3) {
        if (0xef < bVar1) {
          __assert_fail("literal_length < 61",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/snappy/snappy.cc"
                        ,0x2e6,
                        "void snappy::SnappyDecompressor::DecompressAllTags(Writer *) [Writer = snappy::SnappyIOVecWriter]"
                       );
        }
        pbVar5 = (byte *)((long)ip + len_00);
        goto LAB_00165b8f;
      }
      if (0xec < bVar1) {
        len_00 = (ulong)((*(uint *)(char_table + len_00 * 4 + 0x110) & *ip) + 1);
        ip = (uint *)((long)ip + ((ulong)(bVar1 >> 2) - 0x3b));
      }
      len = (long)this->ip_limit_ - (long)ip;
      while (uVar6 = len_00 - len, len <= len_00 && uVar6 != 0) {
        bVar3 = SnappyIOVecWriter::Append(writer,(char *)ip,len);
        if (!bVar3) {
          return;
        }
        (*this->reader_->_vptr_Source[4])(this->reader_,(ulong)this->peeked_);
        iVar4 = (*this->reader_->_vptr_Source[3])(this->reader_,&local_38);
        ip = (uint *)CONCAT44(extraout_var,iVar4);
        this->peeked_ = (uint32)local_38;
        if (local_38 == 0) {
          return;
        }
        this->ip_limit_ = (char *)((long)ip + local_38);
        len = local_38;
        len_00 = uVar6;
      }
      bVar3 = SnappyIOVecWriter::Append(writer,(char *)ip,len_00);
      if (!bVar3) {
        return;
      }
      pbVar5 = (byte *)((long)ip + len_00);
    }
    else {
      uVar2 = *(ushort *)(char_table + (ulong)bVar1 * 2);
      bVar3 = SnappyIOVecWriter::AppendFromSelf
                        (writer,(ulong)((uVar2 & 0x700) +
                                       (*(uint *)(wordmask + (ulong)(uVar2 >> 0xb) * 4) & *ip)),
                         (ulong)uVar2 & 0xff);
      if (!bVar3) {
        return;
      }
      pbVar5 = (byte *)((long)ip + (ulong)(uVar2 >> 0xb));
    }
    if ((long)this->ip_limit_ - (long)pbVar5 < 5) {
      this->ip_ = (char *)pbVar5;
      bVar3 = RefillTag(this);
      pbVar5 = (byte *)this->ip_;
      if (!bVar3) {
        return;
      }
    }
  } while( true );
}

Assistant:

void DecompressAllTags(Writer* writer) {
    const char* ip = ip_;

    // We could have put this refill fragment only at the beginning of the loop.
    // However, duplicating it at the end of each branch gives the compiler more
    // scope to optimize the <ip_limit_ - ip> expression based on the local
    // context, which overall increases speed.
    #define MAYBE_REFILL() \
        if (ip_limit_ - ip < kMaximumTagLength) { \
          ip_ = ip; \
          if (!RefillTag()) return; \
          ip = ip_; \
        }

    MAYBE_REFILL();
    for ( ;; ) {
      const unsigned char c = *(reinterpret_cast<const unsigned char*>(ip++));

      if ((c & 0x3) == LITERAL) {
        size_t literal_length = (c >> 2) + 1u;
        if (writer->TryFastAppend(ip, ip_limit_ - ip, literal_length)) {
          assert(literal_length < 61);
          ip += literal_length;
          // NOTE(user): There is no MAYBE_REFILL() here, as TryFastAppend()
          // will not return true unless there's already at least five spare
          // bytes in addition to the literal.
          continue;
        }
        if (PREDICT_FALSE(literal_length >= 61)) {
          // Long literal.
          const size_t literal_length_length = literal_length - 60;
          literal_length =
              (LittleEndian::Load32(ip) & wordmask[literal_length_length]) + 1;
          ip += literal_length_length;
        }

        size_t avail = ip_limit_ - ip;
        while (avail < literal_length) {
          if (!writer->Append(ip, avail)) return;
          literal_length -= avail;
          reader_->Skip(peeked_);
          size_t n;
          ip = reader_->Peek(&n);
          avail = n;
          peeked_ = avail;
          if (avail == 0) return;  // Premature end of input
          ip_limit_ = ip + avail;
        }
        if (!writer->Append(ip, literal_length)) {
          return;
        }
        ip += literal_length;
        MAYBE_REFILL();
      } else {
        const uint32 entry = char_table[c];
        const uint32 trailer = LittleEndian::Load32(ip) & wordmask[entry >> 11];
        const uint32 length = entry & 0xff;
        ip += entry >> 11;

        // copy_offset/256 is encoded in bits 8..10.  By just fetching
        // those bits, we get copy_offset (since the bit-field starts at
        // bit 8).
        const uint32 copy_offset = entry & 0x700;
        if (!writer->AppendFromSelf(copy_offset + trailer, length)) {
          return;
        }
        MAYBE_REFILL();
      }
    }

#undef MAYBE_REFILL
  }